

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O2

void __thiscall FastPForLib::FastPForTest::SetUp(FastPForTest *this)

{
  IntegerCODEC *pIVar1;
  bool bVar2;
  ParamType *pPVar3;
  FastPFor<4U> *this_00;
  undefined8 *puVar4;
  logic_error *this_01;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pPVar3 = testing::
           WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::GetParam();
  std::__cxx11::string::string((string *)&name,(string *)pPVar3);
  bVar2 = std::operator==(&name,"FastPFor128");
  if (bVar2) {
    this_00 = (FastPFor<4U> *)operator_new(0x78);
    FastPFor<4U>::FastPFor(this_00,0x10000);
  }
  else {
    bVar2 = std::operator==(&name,"FastPFor256");
    if (!bVar2) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      this_01 = (logic_error *)operator_new(0x10);
      std::operator+(&local_40,"Unknown codec ",&name);
      std::logic_error::logic_error(this_01,(string *)&local_40);
      *puVar4 = this_01;
      __cxa_throw(puVar4,&std::logic_error*::typeinfo,0);
    }
    this_00 = (FastPFor<4U> *)operator_new(0x78);
    FastPFor<8U>::FastPFor((FastPFor<8U> *)this_00,0x10000);
  }
  pIVar1 = (this->codec)._M_t.
           super___uniq_ptr_impl<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>
           ._M_t.
           super__Tuple_impl<0UL,_FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>
           .super__Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false>._M_head_impl;
  (this->codec)._M_t.
  super___uniq_ptr_impl<FastPForLib::IntegerCODEC,_std::default_delete<FastPForLib::IntegerCODEC>_>.
  _M_t.
  super__Tuple_impl<0UL,_FastPForLib::IntegerCODEC_*,_std::default_delete<FastPForLib::IntegerCODEC>_>
  .super__Head_base<0UL,_FastPForLib::IntegerCODEC_*,_false>._M_head_impl =
       &this_00->super_IntegerCODEC;
  if (pIVar1 != (IntegerCODEC *)0x0) {
    (*pIVar1->_vptr_IntegerCODEC[5])();
  }
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

virtual void SetUp() {
        std::string name = GetParam();
        if (name == "FastPFor128") {
          codec.reset(new FastPFor<4>());
        } else if (name == "FastPFor256") {
          codec.reset(new FastPFor<8>());
        } else {
          throw new std::logic_error("Unknown codec " + name);
        }
      }